

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

termchar * term_bidi_line(Terminal *term,termline *ldata,wchar_t scr_y)

{
  unsigned_short uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  uint uVar4;
  bidi_char *pbVar5;
  termchar *ptVar6;
  bidi_char *pbVar7;
  termchar *ptVar8;
  uint local_60;
  uint local_5c;
  int local_48;
  wchar_t j;
  wchar_t ipos;
  wchar_t opos;
  wchar_t nbc;
  unsigned_long uc;
  termchar *ptStack_28;
  wchar_t it;
  termchar *lchars;
  wchar_t scr_y_local;
  termline *ldata_local;
  Terminal *term_local;
  
  if ((((term->no_bidi & 1U) == 0) || ((term->no_arabicshaping & 1U) == 0)) ||
     (((ldata->trusted & 1U) != 0 && (L'\x03' < term->cols)))) {
    _Var3 = term_bidi_cache_hit(term,scr_y,ldata->chars,term->cols,(_Bool)(ldata->trusted & 1));
    if (_Var3) {
      ptStack_28 = term->post_bidi_cache[scr_y].chars;
    }
    else {
      if (term->wcFromTo_size < term->cols) {
        term->wcFromTo_size = term->cols;
        pbVar5 = (bidi_char *)saferealloc(term->wcFrom,(long)term->wcFromTo_size,0xc);
        term->wcFrom = pbVar5;
        pbVar5 = (bidi_char *)saferealloc(term->wcTo,(long)term->wcFromTo_size,0xc);
        term->wcTo = pbVar5;
      }
      for (uc._4_4_ = L'\0'; uc._4_4_ < term->cols; uc._4_4_ = uc._4_4_ + L'\x01') {
        _opos = ldata->chars[uc._4_4_].chr;
        uVar4 = (uint)_opos & 0xffffff00;
        if (uVar4 == 0xd800) {
LAB_0010ff5d:
          _opos = (ulong)term->ucsdata->unitab_line[_opos & 0xff];
        }
        else if (uVar4 == 0xd900) {
          if ((term->rawcnp & 1U) != 0) goto LAB_0010ff5d;
          _opos = (ulong)term->ucsdata->unitab_xterm[_opos & 0xff];
        }
        else if (uVar4 == 0xda00) {
          _opos = (ulong)term->ucsdata->unitab_scoacs[_opos & 0xff];
        }
        if ((opos & 0xffffff00U) == 0xdc00) {
          opos = term->ucsdata->unitab_oemcp[_opos & 0xff];
        }
        else if ((opos & 0xffffff00U) == 0xdd00) {
          opos = term->ucsdata->unitab_font[_opos & 0xff];
        }
        term->wcFrom[uc._4_4_].wc = opos;
        term->wcFrom[uc._4_4_].origwc = opos;
        term->wcFrom[uc._4_4_].index = (unsigned_short)uc._4_4_;
        term->wcFrom[uc._4_4_].nchars = 1;
      }
      if (((ldata->trusted & 1U) != 0) && (L'\x03' < term->cols)) {
        memmove(term->wcFrom + 3,term->wcFrom,(long)(term->cols + L'\xfffffffd') * 0xc);
        for (uc._4_4_ = 0; uc._4_4_ < 3; uc._4_4_ = uc._4_4_ + 1) {
          if (uc._4_4_ == 0) {
            local_5c = 0xdffe;
          }
          else {
            local_5c = 0x20;
            if (uc._4_4_ == 1) {
              local_5c = 0xdfff;
            }
          }
          term->wcFrom[uc._4_4_].wc = local_5c;
          term->wcFrom[uc._4_4_].origwc = local_5c;
          term->wcFrom[uc._4_4_].index = 0xffff;
          term->wcFrom[uc._4_4_].nchars = 1;
        }
      }
      ipos = L'\0';
      for (uc._4_4_ = L'\0'; uc._4_4_ < term->cols; uc._4_4_ = uc._4_4_ + L'\x01') {
        pbVar5 = term->wcFrom + ipos;
        pbVar7 = term->wcFrom + uc._4_4_;
        uVar4 = pbVar7->wc;
        pbVar5->origwc = pbVar7->origwc;
        pbVar5->wc = uVar4;
        uVar1 = pbVar7->nchars;
        pbVar5->index = pbVar7->index;
        pbVar5->nchars = uVar1;
        if ((uc._4_4_ + L'\x01' < term->cols) && (term->wcFrom[uc._4_4_ + L'\x01'].wc == 0xdfff)) {
          term->wcFrom[ipos].nchars = term->wcFrom[ipos].nchars + 1;
          uc._4_4_ = uc._4_4_ + L'\x01';
        }
        ipos = ipos + L'\x01';
      }
      if ((term->no_bidi & 1U) == 0) {
        do_bidi(term->bidi_ctx,term->wcFrom,(long)ipos);
      }
      if ((term->no_arabicshaping & 1U) == 0) {
        do_shape(term->wcFrom,term->wcTo,ipos);
      }
      else {
        memcpy(term->wcTo,term->wcFrom,(long)ipos * 0xc);
      }
      if (term->ltemp_size < ldata->size) {
        term->ltemp_size = ldata->size;
        ptVar6 = (termchar *)saferealloc(term->ltemp,(long)term->ltemp_size,0x20);
        term->ltemp = ptVar6;
      }
      memcpy(term->ltemp,ldata->chars,(long)ldata->size << 5);
      j = L'\0';
      for (uc._4_4_ = L'\0'; uc._4_4_ < ipos; uc._4_4_ = uc._4_4_ + L'\x01') {
        uVar4 = (uint)term->wcTo[uc._4_4_].index;
        for (local_48 = 0; local_48 < (int)(uint)term->wcTo[uc._4_4_].nchars;
            local_48 = local_48 + 1) {
          if (uVar4 == 0xffff) {
            ptVar6 = term->ltemp + j;
            ptVar6->chr = (term->basic_erase_char).chr;
            ptVar6->attr = (term->basic_erase_char).attr;
            ptVar6->truecolour = (term->basic_erase_char).truecolour;
            uVar2 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
            ptVar6->cc_next = (term->basic_erase_char).cc_next;
            *(undefined4 *)&ptVar6->field_0x1c = uVar2;
            if (local_48 < 1) {
              local_60 = term->wcTo[uc._4_4_].origwc;
            }
            else {
              local_60 = 0xdfff;
            }
            term->ltemp[j].chr = (ulong)local_60;
          }
          else {
            ptVar6 = term->ltemp + j;
            ptVar8 = ldata->chars + (int)uVar4;
            ptVar6->chr = ptVar8->chr;
            ptVar6->attr = ptVar8->attr;
            ptVar6->truecolour = ptVar8->truecolour;
            uVar2 = *(undefined4 *)&ptVar8->field_0x1c;
            ptVar6->cc_next = ptVar8->cc_next;
            *(undefined4 *)&ptVar6->field_0x1c = uVar2;
            if (term->ltemp[j].cc_next != L'\0') {
              term->ltemp[j].cc_next = term->ltemp[j].cc_next - (j - uVar4);
            }
            if (local_48 < 1) {
              if (term->wcTo[uc._4_4_].origwc != term->wcTo[uc._4_4_].wc) {
                term->ltemp[j].chr = (ulong)term->wcTo[uc._4_4_].wc;
              }
            }
            else {
              term->ltemp[j].chr = 0xdfff;
            }
          }
          j = j + L'\x01';
        }
      }
      if (j != term->cols) {
        __assert_fail("opos == term->cols",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0x16e9,"termchar *term_bidi_line(Terminal *, struct termline *, int)");
      }
      term_bidi_cache_store
                (term,scr_y,ldata->chars,term->ltemp,term->wcTo,term->cols,ldata->size,
                 (_Bool)(ldata->trusted & 1));
      ptStack_28 = term->ltemp;
    }
  }
  else {
    ptStack_28 = (termchar *)0x0;
  }
  return ptStack_28;
}

Assistant:

static termchar *term_bidi_line(Terminal *term, struct termline *ldata,
                                int scr_y)
{
    termchar *lchars;
    int it;

    /* Do Arabic shaping and bidi. */
    if (!term->no_bidi || !term->no_arabicshaping ||
        (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH)) {

        if (!term_bidi_cache_hit(term, scr_y, ldata->chars, term->cols,
                                 ldata->trusted)) {

            if (term->wcFromTo_size < term->cols) {
                term->wcFromTo_size = term->cols;
                term->wcFrom = sresize(term->wcFrom, term->wcFromTo_size,
                                       bidi_char);
                term->wcTo = sresize(term->wcTo, term->wcFromTo_size,
                                     bidi_char);
            }

            for(it=0; it<term->cols ; it++)
            {
                unsigned long uc = (ldata->chars[it].chr);

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                term->wcFrom[it].origwc = term->wcFrom[it].wc =
                    (unsigned int)uc;
                term->wcFrom[it].index = it;
                term->wcFrom[it].nchars = 1;
            }

            if (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH) {
                memmove(
                    term->wcFrom + TRUST_SIGIL_WIDTH, term->wcFrom,
                    (term->cols - TRUST_SIGIL_WIDTH) * sizeof(*term->wcFrom));
                for (it = 0; it < TRUST_SIGIL_WIDTH; it++) {
                    term->wcFrom[it].origwc = term->wcFrom[it].wc =
                        (it == 0 ? TRUST_SIGIL_CHAR :
                         it == 1 ? UCSWIDE : ' ');
                    term->wcFrom[it].index = BIDI_CHAR_INDEX_NONE;
                    term->wcFrom[it].nchars = 1;
                }
            }

            int nbc = 0;
            for (it = 0; it < term->cols; it++) {
                term->wcFrom[nbc] = term->wcFrom[it];
                if (it+1 < term->cols && term->wcFrom[it+1].wc == UCSWIDE) {
                    term->wcFrom[nbc].nchars++;
                    it++;
                }
                nbc++;
            }

            if(!term->no_bidi)
                do_bidi(term->bidi_ctx, term->wcFrom, nbc);

            if(!term->no_arabicshaping) {
                do_shape(term->wcFrom, term->wcTo, nbc);
            } else {
                /* If we're not calling do_shape, we must copy the
                 * data into wcTo anyway, unchanged */
                memcpy(term->wcTo, term->wcFrom, nbc * sizeof(*term->wcTo));
            }

            if (term->ltemp_size < ldata->size) {
                term->ltemp_size = ldata->size;
                term->ltemp = sresize(term->ltemp, term->ltemp_size,
                                      termchar);
            }

            memcpy(term->ltemp, ldata->chars, ldata->size * TSIZE);

            int opos = 0;
            for (it=0; it<nbc; it++) {
                int ipos = term->wcTo[it].index;
                for (int j = 0; j < term->wcTo[it].nchars; j++) {
                    if (ipos != BIDI_CHAR_INDEX_NONE) {
                        term->ltemp[opos] = ldata->chars[ipos];
                        if (term->ltemp[opos].cc_next)
                            term->ltemp[opos].cc_next -= opos - ipos;

                        if (j > 0)
                            term->ltemp[opos].chr = UCSWIDE;
                        else if (term->wcTo[it].origwc != term->wcTo[it].wc)
                            term->ltemp[opos].chr = term->wcTo[it].wc;
                    } else {
                        term->ltemp[opos] = term->basic_erase_char;
                        term->ltemp[opos].chr =
                            j > 0 ? UCSWIDE : term->wcTo[it].origwc;
                    }
                    opos++;
                }
            }
            assert(opos == term->cols);
            term_bidi_cache_store(term, scr_y, ldata->chars,
                                  term->ltemp, term->wcTo,
                                  term->cols, ldata->size, ldata->trusted);

            lchars = term->ltemp;
        } else {
            lchars = term->post_bidi_cache[scr_y].chars;
        }
    } else {
        lchars = NULL;
    }

    return lchars;
}